

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bibOutline.cpp
# Opt level: O2

EntryData * getEntryData(EntryData *__return_storage_ptr__,TSNode entryNode,File *file)

{
  TSNode self;
  TSNode node;
  TSNode node_00;
  int iVar1;
  uint32_t uVar2;
  char *pcVar3;
  undefined8 unaff_RBX;
  uint32_t i;
  uint32_t child_index;
  TSTree *unaff_R12;
  Range RVar4;
  TSNode child;
  string local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffffc0;
  
  pcVar3 = ts_node_type(entryNode);
  iVar1 = strcmp(pcVar3,"entry");
  if (iVar1 != 0) {
    __assert_fail("strcmp(ts_node_type(entryNode), \"entry\") == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/src/handlers/outline/bibOutline.cpp"
                  ,0x12,"EntryData getEntryData(TSNode, File &)");
  }
  node.id = (void *)unaff_RBX;
  node.context = (uint32_t  [4])in_stack_ffffffffffffffc0;
  node.tree = unaff_R12;
  RVar4 = nodeRange(node);
  EntryData::EntryData(__return_storage_ptr__,RVar4);
  uVar2 = ts_node_named_child_count(entryNode);
  child_index = 0;
  do {
    if (uVar2 == child_index) {
      return __return_storage_ptr__;
    }
    ts_node_named_child(&child,entryNode,child_index);
    self.context[2] = child.context[2];
    self.context[3] = child.context[3];
    self.context[0] = child.context[0];
    self.context[1] = child.context[1];
    self.id = child.id;
    self.tree = child.tree;
    pcVar3 = ts_node_type(self);
    iVar1 = strcmp(pcVar3,"name");
    if (iVar1 == 0) {
      File::utf8TextForNode_abi_cxx11_((string *)local_50,file,&child);
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,local_50);
      std::__cxx11::string::~string(local_50);
      node_00.id = (void *)unaff_RBX;
      node_00.context = (uint32_t  [4])in_stack_ffffffffffffffc0;
      node_00.tree = unaff_R12;
      RVar4 = nodeRange(node_00);
      __return_storage_ptr__->selectionRange = RVar4;
      setEntryKind(__return_storage_ptr__);
    }
    else {
      iVar1 = strcmp(pcVar3,"key");
      if (iVar1 == 0) {
        File::utf8TextForNode_abi_cxx11_((string *)local_50,file,&child);
        std::__cxx11::string::operator=((string *)&__return_storage_ptr__->key,local_50);
        std::__cxx11::string::~string(local_50);
        return __return_storage_ptr__;
      }
    }
    child_index = child_index + 1;
  } while( true );
}

Assistant:

EntryData getEntryData (TSNode entryNode, File &file) {
    assert(strcmp(ts_node_type(entryNode), "entry") == 0);

    EntryData data { nodeRange(entryNode) };

    auto numChildren = ts_node_named_child_count(entryNode);
    for (uint32_t i = 0; i < numChildren; i++) {
        TSNode child = ts_node_named_child(entryNode, i);
        const char *type = ts_node_type(child);
        if (strcmp(type, "name") == 0) {
            data.name = file.utf8TextForNode(child);
            data.selectionRange = nodeRange(child);
            setEntryKind(data);
        } else if (strcmp(type, "key") == 0) {
            data.key = file.utf8TextForNode(child);
            return data;
        }
    }

    return data;
}